

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-sharedata.c
# Opt level: O2

int ishashkey(context *ctx,lua_State *L,int index,int *key,uint32_t *keyhash,int *keytype)

{
  size_t sz_00;
  int iVar1;
  uint32_t uVar2;
  int iVar3;
  lua_Integer lVar4;
  char *str;
  undefined4 in_register_00000014;
  size_t sz;
  
  iVar3 = ctx->tbl->sizearray;
  iVar1 = lua_type(L,-2);
  if (iVar1 == 3) {
    lVar4 = lua_tointegerx(L,-2,(int *)0x0);
    iVar1 = (int)lVar4;
    *(int *)CONCAT44(in_register_00000014,index) = iVar1;
    if ((0 < iVar1) && (iVar1 <= iVar3)) {
      return 0;
    }
    *key = iVar1;
    *keyhash = 0;
  }
  else {
    sz = 0;
    str = lua_tolstring(L,-2,&sz);
    sz_00 = sz;
    uVar2 = calchash(str,sz);
    *key = uVar2;
    iVar3 = stringindex(ctx,str,sz_00);
    *(int *)CONCAT44(in_register_00000014,index) = iVar3;
    *keyhash = 1;
  }
  return 1;
}

Assistant:

static int
ishashkey(struct context * ctx, lua_State *L, int index, int *key, uint32_t *keyhash, int *keytype) {
	int sizearray = ctx->tbl->sizearray;
	int kt = lua_type(L, index);
	if (kt == LUA_TNUMBER) {
		*key = lua_tointeger(L, index);
		if (*key > 0 && *key <= sizearray) {
			return 0;
		}
		*keyhash = (uint32_t)*key;
		*keytype = KEYTYPE_INTEGER;
	} else {
		size_t sz = 0;
		const char * s = lua_tolstring(L, index, &sz);
		*keyhash = calchash(s, sz);
		*key = stringindex(ctx, s, sz);
		*keytype = KEYTYPE_STRING;
	}
	return 1;
}